

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ags_t AGSSock::Socket_SendDataTo(Socket *sock,SockAddr *addr,SockData *data)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  pointer __buf;
  size_type __n;
  bool bVar4;
  
  __n = (data->data)._M_string_length;
  bVar4 = __n == 0;
  if (!bVar4) {
    __buf = (data->data)._M_dataplus._M_p;
    while( true ) {
      sVar1 = sendto(sock->id,__buf,__n,0,(sockaddr *)addr,0x80);
      if (sVar1 == -1) break;
      __n = __n - sVar1;
      bVar4 = __n == 0;
      if (bVar4) break;
      __buf = __buf + sVar1;
    }
  }
  piVar2 = __errno_location();
  iVar3 = 0;
  if (*piVar2 != 0xb) {
    iVar3 = *piVar2;
  }
  sock->error = iVar3;
  return (ulong)bVar4;
}

Assistant:

ags_t Socket_SendDataTo(Socket *sock, const SockAddr *addr, const SockData *data)
{
	return sendto_impl(sock, addr, data->data.data(), data->data.size());
}